

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

int coda_data_dictionary_find_definition_for_product
              (coda_product *product,coda_product_definition **definition)

{
  int iVar1;
  long in_FS_OFFSET;
  coda_cursor_conflict cursor;
  
  iVar1 = coda_cursor_set_product(&cursor,product);
  if (iVar1 == 0) {
    iVar1 = coda_evaluate_detection_node
                      (*(coda_detection_node **)
                        (*(long *)(in_FS_OFFSET + -0x18) + 0x18 +
                        (ulong)(product->format + (uint)(product->format == coda_format_ascii)) * 8)
                       ,&cursor,definition);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coda_data_dictionary_find_definition_for_product(coda_product *product, coda_product_definition **definition)
{
    coda_cursor cursor;

    if (coda_cursor_set_product(&cursor, product) != 0)
    {
        return -1;
    }

    return coda_evaluate_detection_node(coda_data_dictionary_get_detection_tree(product->format), &cursor, definition);
}